

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O2

void __thiscall
SemanticAnalyzerRun::onEnterReturnStatementAstNode
          (SemanticAnalyzerRun *this,ReturnStatementAstNode *node)

{
  string local_48;
  allocator<char> local_21;
  
  if (this->functionDept == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Return statements can only be used from within functions.",
               &local_21);
    reportError(this,&node->returnToken,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void onEnterReturnStatementAstNode(ReturnStatementAstNode*  node) noexcept override {
    if (functionDept == 0) {
      this->reportError(node->returnToken, "Return statements can only be used from within functions.");
    }
  }